

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recog_intel.c
# Opt level: O0

int decode_intel_extended_topology(cpu_raw_data_t *raw,cpu_id_t *data)

{
  char cVar1;
  bool bVar2;
  uint local_30;
  uint local_2c;
  int num_core;
  int num_smt;
  int level_type;
  int i;
  cpu_id_t *data_local;
  cpu_raw_data_t *raw_local;
  
  local_2c = 0xffffffff;
  local_30 = 0xffffffff;
  num_smt = 0;
  while( true ) {
    bVar2 = false;
    if ((num_smt < 4) && (bVar2 = false, raw->intel_fn11[num_smt][0] != 0)) {
      bVar2 = raw->intel_fn11[num_smt][1] != 0;
    }
    if (!bVar2) break;
    cVar1 = *(char *)((long)raw->intel_fn11[num_smt] + 9);
    if (cVar1 == '\x01') {
      local_2c = raw->intel_fn11[num_smt][1] & 0xffff;
    }
    else if (cVar1 == '\x02') {
      local_30 = raw->intel_fn11[num_smt][1] & 0xffff;
    }
    num_smt = num_smt + 1;
  }
  if ((local_2c == 0xffffffff) || (local_30 == 0xffffffff)) {
    raw_local._4_4_ = 0;
  }
  else {
    data->num_logical_cpus = local_30;
    data->num_cores = (int)local_30 / (int)local_2c;
    if (data->num_cores < 1) {
      data->num_cores = 1;
    }
    raw_local._4_4_ = 1;
  }
  return raw_local._4_4_;
}

Assistant:

static int decode_intel_extended_topology(struct cpu_raw_data_t* raw, struct cpu_id_t* data)
{
	int i, level_type, num_smt = -1, num_core = -1;

	for (i = 0; (i < MAX_INTELFN11_LEVEL) && (raw->intel_fn11[i][EAX] != 0x0) && (raw->intel_fn11[i][EBX] != 0x0); i++) {
		level_type = EXTRACTS_BITS(raw->intel_fn11[i][ECX], 15, 8);
		switch (level_type) {
			case 0x01:
				num_smt = EXTRACTS_BITS(raw->intel_fn11[i][EBX], 15, 0);
				break;
			case 0x02:
				num_core = EXTRACTS_BITS(raw->intel_fn11[i][EBX], 15, 0);
				break;
			default:
				break;
		}
	}
	if (num_smt == -1 || num_core == -1) return 0;
	data->num_logical_cpus = num_core;
	data->num_cores = num_core / num_smt;
	// make sure num_cores is at least 1. In VMs, the CPUID instruction
	// is rigged and may give nonsensical results, but we should at least
	// avoid outputs like data->num_cores == 0.
	if (data->num_cores <= 0) data->num_cores = 1;
	return 1;
}